

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

void Gia_ManPrintTents_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vObjs)

{
  int iVar1;
  uint uVar2;
  
  while( true ) {
    iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
    if (iVar1 != 0) {
      return;
    }
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjId(p,pObj);
    Vec_IntPush(vObjs,iVar1);
    if ((~(uint)*(ulong *)pObj & 0x9fffffff) == 0) {
      return;
    }
    Gia_ManPrintTents_rec(p,pObj + -(*(ulong *)pObj & 0x1fffffff),vObjs);
    uVar2 = (uint)*(undefined8 *)pObj;
    if ((int)uVar2 < 0) {
      return;
    }
    if ((uVar2 & 0x1fffffff) == 0x1fffffff) break;
    pObj = pObj + -(ulong)((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff);
  }
  return;
}

Assistant:

void Gia_ManPrintTents_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vObjs )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    Vec_IntPush( vObjs, Gia_ObjId(p, pObj) );
    if ( Gia_ObjIsCi(pObj) )
        return;
    Gia_ManPrintTents_rec( p, Gia_ObjFanin0(pObj), vObjs );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManPrintTents_rec( p, Gia_ObjFanin1(pObj), vObjs );
}